

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

Status google::protobuf::json_internal::anon_unknown_5::
       ParseTimestamp<google::protobuf::json_internal::ParseProto3Type>
                 (JsonLexer *lex,Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
                 Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  char cVar1;
  bool bVar2;
  Status SVar3;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  aVar4;
  optional<unsigned_int> oVar5;
  optional<unsigned_int> oVar6;
  optional<unsigned_int> oVar7;
  _Optional_payload_base<int> _Var8;
  size_t sVar9;
  ulong uVar10;
  Field pFVar11;
  uintptr_t extraout_RAX;
  Msg *in_RCX;
  char *pcVar12;
  ulong uVar13;
  undefined8 uVar14;
  char *in_R8;
  _Storage<unsigned_int,_true> _Var15;
  uint uVar16;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  *__return_storage_ptr__;
  string_view end;
  string_view end_00;
  string_view end_01;
  string_view end_02;
  string_view end_03;
  string_view end_04;
  string_view end_05;
  string_view end_06;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  string_view local_c0;
  int local_ac;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
  local_a8;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_a0;
  _Variadic_union<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::json_internal::MaybeOwnedString::StreamOwned>
  local_70;
  _Storage<unsigned_int,_true> local_50;
  _Storage<unsigned_int,_true> local_48;
  Msg *local_40;
  _Optional_payload_base<int> local_38;
  
  local_40 = in_RCX;
  JsonLexer::PeekKind((JsonLexer *)&local_a8.status_);
  aVar4 = local_a8;
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOrData
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&local_a8.status_);
  if ((aVar4 == (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                 )0x1) && (local_a0._0_4_ == 6)) {
    SVar3 = JsonLexer::Expect(lex,desc,4,"null");
    return (Status)SVar3.rep_;
  }
  __return_storage_ptr__ = &local_a8;
  JsonLexer::ParseUtf8
            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              *)&__return_storage_ptr__->status_,(JsonLexer *)desc);
  (lex->stream_).stream_ = (ZeroCopyInputStream *)local_a8;
  aVar4 = local_a8;
  if (((ulong)local_a8 & 1) == 0) {
    LOCK();
    *(int *)local_a8 = *(int *)local_a8 + 1;
    UNLOCK();
    aVar4.status_.rep_ = (Status)(lex->stream_).stream_;
  }
  if (aVar4 != (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
                )0x1) goto LAB_002c3d5f;
  if (local_a8 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
       )0x1) {
    local_c0 = MaybeOwnedString::AsView((MaybeOwnedString *)&local_a0._M_first);
    if (local_c0._M_len < 0x14) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x1a,"timestamp string too short");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3c12;
    }
    end._M_str = in_R8;
    end._M_len = (size_t)"-";
    oVar5 = TakeTimeDigitsWithSuffixAndAdvance((anon_unknown_5 *)&local_c0,(string_view *)0x4,1,end)
    ;
    if ((oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged &
        oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload != 0) == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x15,"bad year in timestamp");
        goto LAB_002c3d5f;
      }
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3d85:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3d8f:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3d99:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3da3:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3dad:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3db7:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
      goto LAB_002c3dc1;
    }
    end_00._M_str = in_R8;
    end_00._M_len = (size_t)"-";
    oVar6 = TakeTimeDigitsWithSuffixAndAdvance
                      ((anon_unknown_5 *)&local_c0,(string_view *)0x2,1,end_00);
    _Var15._M_value =
         oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
        _Var15._M_value == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x16,"bad month in timestamp");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3d85;
    }
    end_01._M_str = in_R8;
    end_01._M_len = (size_t)"T";
    oVar6 = TakeTimeDigitsWithSuffixAndAdvance
                      ((anon_unknown_5 *)&local_c0,(string_view *)0x2,1,end_01);
    if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
        oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_payload == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x14,"bad day in timestamp");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3d8f;
    }
    end_02._M_str = in_R8;
    end_02._M_len = (size_t)":";
    _local_48 = (_Optional_payload_base<unsigned_int>)
                TakeTimeDigitsWithSuffixAndAdvance
                          ((anon_unknown_5 *)&local_c0,(string_view *)0x2,1,end_02);
    if (((ulong)_local_48 & 0x100000000) == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x16,"bad hours in timestamp");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3d99;
    }
    end_03._M_str = in_R8;
    end_03._M_len = (size_t)":";
    _local_50 = (_Optional_payload_base<unsigned_int>)
                TakeTimeDigitsWithSuffixAndAdvance
                          ((anon_unknown_5 *)&local_c0,(string_view *)0x2,1,end_03);
    if (((ulong)_local_50 & 0x100000000) == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x18,"bad minutes in timestamp");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3da3;
    }
    end_04._M_str = in_R8;
    end_04._M_len = (size_t)"";
    oVar7 = TakeTimeDigitsWithSuffixAndAdvance
                      ((anon_unknown_5 *)&local_c0,(string_view *)0x2,0,end_04);
    if (((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,0x18,"bad seconds in timestamp");
        goto LAB_002c3d5f;
      }
      goto LAB_002c3dad;
    }
    local_ac = _Var15._M_value + 9;
    if (2 < _Var15._M_value) {
      local_ac = _Var15._M_value - 3;
    }
    _Var8 = (_Optional_payload_base<int>)TakeNanosAndAdvance(&local_c0);
    if (((ulong)_Var8 & 0x100000000) == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar12 = "timestamp had bad nanoseconds";
        uVar14 = 0x1d;
LAB_002c3c00:
        JsonLocation::Invalid((JsonLocation *)lex,&local_70,uVar14,pcVar12);
        goto LAB_002c3d5f;
      }
      goto LAB_002c3db7;
    }
    local_38 = _Var8;
    if (local_c0._M_len == 0) {
      if (local_a8 ==
          (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
           )0x1) {
        pcVar12 = "timestamp missing timezone offset";
        uVar14 = 0x21;
        goto LAB_002c3c00;
      }
      goto LAB_002c3db7;
    }
    uVar16 = (oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload - (uint)(_Var15._M_value < 3)) +
             0x12c0;
    end_05._M_str._0_4_ =
         uVar16 * 0x16d + uVar16 / 400 + ((uVar16 >> 2) - uVar16 / 100) +
         (local_ac * 0xf4ff + 0x301U >> 0xb);
    __return_storage_ptr__ =
         (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
          *)(((ulong)oVar7.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                     super__Optional_payload_base<unsigned_int> & 0xffffffff) +
             (ulong)(local_50._M_value * 0x3c) + (ulong)(local_48._M_value * 0xe10) +
            (long)(int)((uint)end_05._M_str +
                        oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload + -0x25bab9) * 0x15180
            );
    cVar1 = *local_c0._M_str;
    if (cVar1 != '+') {
      sVar9 = local_c0._M_len;
      if (cVar1 == 'Z') goto LAB_002c3c1c;
      if (cVar1 == '-') {
        bVar2 = true;
        goto LAB_002c3c45;
      }
      goto LAB_002c3c26;
    }
    bVar2 = false;
LAB_002c3c45:
    if (local_c0._M_len == 6) {
      local_c0._M_str = local_c0._M_str + 1;
      local_c0._M_len = 5;
      end_05._M_len = (size_t)":";
      end_05._M_str._4_4_ = 0;
      pcVar12 = (char *)(ulong)(uint)end_05._M_str;
      oVar5 = TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)&local_c0,(string_view *)0x2,1,end_05);
      end_06._M_str = pcVar12;
      end_06._M_len = (size_t)"";
      oVar6 = TakeTimeDigitsWithSuffixAndAdvance
                        ((anon_unknown_5 *)&local_c0,(string_view *)0x2,0,end_06);
      if (((ulong)oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
          ((ulong)oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
        if (local_a8 !=
            (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
             )0x1) goto LAB_002c3dcb;
        JsonLocation::Invalid
                  ((JsonLocation *)lex,&local_70,0x2a,"timestamp offset has bad hours and minutes");
        goto LAB_002c3d5f;
      }
      uVar10 = (ulong)((oVar6.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>._M_payload +
                       oVar5.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                       super__Optional_payload_base<unsigned_int>._M_payload * 0x3c) * 0x3c);
      uVar13 = -uVar10;
      if (bVar2) {
        uVar13 = uVar10;
      }
      __return_storage_ptr__ =
           (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
            *)((long)&((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&(__return_storage_ptr__->status_).rep_)->field_0 + uVar13);
      goto LAB_002c3d10;
    }
    if (local_a8 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) goto LAB_002c3dc1;
    pcVar12 = "timestamp offset of wrong size.";
    uVar14 = 0x1f;
  }
  else {
LAB_002c3c12:
    sVar9 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3c1c:
    if (sVar9 == 1) {
LAB_002c3d10:
      pFVar11 = Proto3Type::MustHaveField(msg,1);
      _Var8 = local_38;
      ParseProto3Type::
      SetInt<long,(google::protobuf::Field_Kind)3,(google::protobuf::Field_Kind)16,(google::protobuf::Field_Kind)18>
                (pFVar11,local_40,(long)__return_storage_ptr__);
      pFVar11 = Proto3Type::MustHaveField(msg,2);
      ParseProto3Type::
      SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
                (pFVar11,local_40,_Var8._M_payload._M_value);
      (lex->stream_).stream_ = (ZeroCopyInputStream *)0x1;
      goto LAB_002c3d5f;
    }
LAB_002c3c26:
    if (local_a8 !=
        (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_1
         )0x1) {
LAB_002c3dc1:
      absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
LAB_002c3dcb:
      uVar14 = absl::lts_20240722::internal_statusor::Helper::Crash(&local_a8.status_);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&local_a8.status_);
      _Unwind_Resume(uVar14);
    }
    pcVar12 = "bad timezone offset";
    uVar14 = 0x13;
  }
  JsonLocation::Invalid((JsonLocation *)lex,&local_70,uVar14,pcVar12);
LAB_002c3d5f:
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   *)&local_a8.status_);
  return (Status)extraout_RAX;
}

Assistant:

absl::Status ParseTimestamp(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  if (lex.Peek(JsonLexer::kNull)) {
    return lex.Expect("null");
  }

  absl::StatusOr<LocationWith<MaybeOwnedString>> str = lex.ParseUtf8();
  RETURN_IF_ERROR(str.status());

  absl::string_view data = str->value.AsView();
  if (data.size() < 20) {
    return str->loc.Invalid("timestamp string too short");
  }

  int64_t secs;
  {
    /* 1972-01-01T01:00:00 */
    auto year = TakeTimeDigitsWithSuffixAndAdvance(data, 4, "-");
    if (!year.has_value() || *year == 0) {
      return str->loc.Invalid("bad year in timestamp");
    }
    auto mon = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "-");
    if (!mon.has_value() || *mon == 0) {
      return str->loc.Invalid("bad month in timestamp");
    }
    auto day = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "T");
    if (!day.has_value() || *day == 0) {
      return str->loc.Invalid("bad day in timestamp");
    }
    auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!hour.has_value()) {
      return str->loc.Invalid("bad hours in timestamp");
    }
    auto min = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
    if (!min.has_value()) {
      return str->loc.Invalid("bad minutes in timestamp");
    }
    auto sec = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
    if (!sec.has_value()) {
      return str->loc.Invalid("bad seconds in timestamp");
    }

    uint32_t m_adj = *mon - 3;  // March-based month.
    uint32_t carry = m_adj > *mon ? 1 : 0;

    uint32_t year_base = 4800;  // Before min year, multiple of 400.
    uint32_t y_adj = *year + year_base - carry;

    uint32_t month_days = ((m_adj + carry * 12) * 62719 + 769) / 2048;
    uint32_t leap_days = y_adj / 4 - y_adj / 100 + y_adj / 400;
    int32_t epoch_days =
        y_adj * 365 + leap_days + month_days + (*day - 1) - 2472632;

    secs = int64_t{epoch_days} * 86400 + *hour * 3600 + *min * 60 + *sec;
  }

  auto nanos = TakeNanosAndAdvance(data);
  if (!nanos.has_value()) {
    return str->loc.Invalid("timestamp had bad nanoseconds");
  }

  if (data.empty()) {
    return str->loc.Invalid("timestamp missing timezone offset");
  }

  {
    // [+-]hh:mm or Z
    bool neg = false;
    switch (data[0]) {
      case '-':
        neg = true;
        ABSL_FALLTHROUGH_INTENDED;
      case '+': {
        if (data.size() != 6) {
          return str->loc.Invalid("timestamp offset of wrong size.");
        }

        data = data.substr(1);
        auto hour = TakeTimeDigitsWithSuffixAndAdvance(data, 2, ":");
        auto mins = TakeTimeDigitsWithSuffixAndAdvance(data, 2, "");
        if (!hour.has_value() || !mins.has_value()) {
          return str->loc.Invalid("timestamp offset has bad hours and minutes");
        }

        int64_t offset = (*hour * 60 + *mins) * 60;
        secs += (neg ? offset : -offset);
        break;
      }
      // Lowercase z is not accepted, per the spec.
      case 'Z':
        if (data.size() == 1) {
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      default:
        return str->loc.Invalid("bad timezone offset");
    }
  }

  Traits::SetInt64(Traits::MustHaveField(desc, 1), msg, secs);
  Traits::SetInt32(Traits::MustHaveField(desc, 2), msg, *nanos);

  return absl::OkStatus();
}